

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRType.cpp
# Opt level: O1

IRType IRType_EnsureUnsigned(IRType type)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint uVar4;
  undefined7 in_register_00000039;
  
  if (((CONCAT71(in_register_00000039,type) & 0xffffffff) - 1 < 4) &&
     (uVar4 = (int)CONCAT71(in_register_00000039,type) + 4, type = (IRType)uVar4,
     3 < ((ulong)uVar4 & 0xff) - 5)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRType.cpp"
                       ,0x59,"(IRType_IsUnsignedInt(unsignedType))",
                       "IRType_IsUnsignedInt(unsignedType)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return type;
}

Assistant:

IRType IRType_EnsureUnsigned(IRType type)
{
    CompileAssert(TyUint8 > TyInt8);
    CompileAssert((TyUint8 - TyInt8) == (TyUint16 - TyInt16));
    CompileAssert((TyUint8 - TyInt8) == (TyUint32 - TyInt32));
    CompileAssert((TyUint8 - TyInt8) == (TyUint64 - TyInt64));
    if (IRType_IsSignedInt(type))
    {
        IRType unsignedType = (IRType)(type + (TyUint8 - TyInt8));
        Assert(IRType_IsUnsignedInt(unsignedType));
        return unsignedType;
    }
    return type;
}